

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglyLinkedList.h
# Opt level: O2

string * __thiscall
SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
toString(string *__return_storage_ptr__,
        SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_00;
  int iVar1;
  string *this_00;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pnVar2;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_90);
  if (this->count == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    pnVar2 = this->head;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (iVar1 = 0; iVar1 < this->count; iVar1 = iVar1 + 1) {
      if (iVar1 == this->count + -1) {
        std::__cxx11::string::string((string *)&local_70,(string *)pnVar2);
        libString::to_string<std::__cxx11::string>(&local_90,(libString *)&local_70,n);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_70;
      }
      else {
        std::__cxx11::string::string((string *)&local_50,(string *)pnVar2);
        libString::to_string<std::__cxx11::string>(&local_70,(libString *)&local_50,n_00);
        std::operator+(&local_90,&local_70,", ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_50;
      }
      std::__cxx11::string::~string((string *)this_00);
      pnVar2 = pnVar2->next;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SinglyLinkedList<T>::toString()
{
	std::string output = "";

	if (count == 0)
	{
		output += "[]\n";
	}


	else
	{
		//start at the head of the list.
		node<T> *currentNode = head;
		output += "[";

		int i = 0;

		for (i = 0; i < count; i++)
		{
			if (i == count - 1)
			{
				output += libString::to_string(currentNode->getData());
			}

			else
			{
				output += libString::to_string(currentNode->getData()) + ", ";
			}

			currentNode = currentNode->getNext();
		}

		output += "]";
	}

	return output;
}